

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

Optimizer * __thiscall
spvtools::Optimizer::RegisterSizePasses(Optimizer *this,bool preserve_interface)

{
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  _Var1;
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_138;
  PassToken local_130;
  PassToken local_128;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  spvtools local_50 [8];
  PassToken local_48;
  PassToken local_40;
  PassToken local_38;
  
  CreateWrapOpKillPass();
  RegisterPass(this,&local_60);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_68);
  CreateMergeReturnPass();
  RegisterPass(this,&local_70);
  CreateInlineExhaustivePass();
  RegisterPass(this,&local_78);
  CreateEliminateDeadFunctionsPass();
  RegisterPass(this,&local_80);
  CreatePrivateToLocalPass();
  RegisterPass(this,&local_88);
  CreateScalarReplacementPass((spvtools *)&local_90,0);
  RegisterPass(this,&local_90);
  CreateLocalMultiStoreElimPass();
  RegisterPass(this,&local_98);
  CreateCCPPass();
  RegisterPass(this,&local_a0);
  CreateLoopUnrollPass((spvtools *)&local_a8,true,0);
  RegisterPass(this,&local_a8);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_b0);
  CreateSimplificationPass();
  RegisterPass(this,&local_b8);
  CreateScalarReplacementPass((spvtools *)&local_c0,0);
  RegisterPass(this,&local_c0);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_c8);
  CreateIfConversionPass();
  RegisterPass(this,&local_d0);
  CreateSimplificationPass();
  RegisterPass(this,&local_d8);
  CreateAggressiveDCEPass((spvtools *)&local_e0,preserve_interface);
  RegisterPass(this,&local_e0);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_e8);
  CreateBlockMergePass();
  RegisterPass(this,&local_f0);
  CreateLocalAccessChainConvertPass();
  RegisterPass(this,&local_f8);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_100);
  CreateAggressiveDCEPass((spvtools *)&local_108,preserve_interface);
  RegisterPass(this,&local_108);
  CreateCopyPropagateArraysPass();
  RegisterPass(this,&local_110);
  CreateVectorDCEPass();
  RegisterPass(this,&local_118);
  MakeUnique<spvtools::opt::DeadInsertElimPass>();
  local_120.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )operator_new(8);
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       local_138._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_138._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  *(tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    *)local_120.impl_._M_t.
      super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       _Var1._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  RegisterPass(this,&local_120);
  CreateEliminateDeadMembersPass();
  RegisterPass(this,(PassToken *)&local_138);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_128);
  CreateBlockMergePass();
  RegisterPass(this,&local_130);
  CreateLocalMultiStoreElimPass();
  RegisterPass(this,&local_38);
  CreateRedundancyEliminationPass();
  RegisterPass(this,&local_40);
  CreateSimplificationPass();
  RegisterPass(this,&local_48);
  CreateAggressiveDCEPass(local_50,preserve_interface);
  RegisterPass(this,(PassToken *)local_50);
  CreateCFGCleanupPass();
  RegisterPass(this,&local_58);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken((PassToken *)local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken(&local_38);
  PassToken::~PassToken(&local_130);
  PassToken::~PassToken(&local_128);
  PassToken::~PassToken((PassToken *)&local_138);
  PassToken::~PassToken(&local_120);
  PassToken::~PassToken(&local_118);
  PassToken::~PassToken(&local_110);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  return this;
}

Assistant:

Optimizer& Optimizer::RegisterSizePasses(bool preserve_interface) {
  return RegisterPass(CreateWrapOpKillPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateMergeReturnPass())
      .RegisterPass(CreateInlineExhaustivePass())
      .RegisterPass(CreateEliminateDeadFunctionsPass())
      .RegisterPass(CreatePrivateToLocalPass())
      .RegisterPass(CreateScalarReplacementPass(0))
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateCCPPass())
      .RegisterPass(CreateLoopUnrollPass(true))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateScalarReplacementPass(0))
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateIfConversionPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCopyPropagateArraysPass())
      .RegisterPass(CreateVectorDCEPass())
      .RegisterPass(CreateDeadInsertElimPass())
      .RegisterPass(CreateEliminateDeadMembersPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCFGCleanupPass());
}